

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::InternalSerializeWithCachedSizesToArray
          (CodeGeneratorResponse *this,bool deterministic,uint8 *target)

{
  int iVar1;
  string *psVar2;
  void *pvVar3;
  bool bVar4;
  Type *this_00;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  int index;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    psVar2 = (this->error_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorResponse.error");
    psVar2 = (this->error_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  iVar1 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
                          (&(this->file_).super_RepeatedPtrFieldBase,index);
      *target = 'z';
      pbVar8 = target + 1;
      uVar7 = this_00->_cached_size_;
      uVar6 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar8 = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar4);
      }
      *pbVar8 = (byte)uVar6;
      target = CodeGeneratorResponse_File::InternalSerializeWithCachedSizesToArray
                         (this_00,false,pbVar8 + 1);
      index = index + 1;
    } while (index != iVar1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorResponse::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorResponse)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string error = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->error().data(), this->error().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorResponse.error");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->error(), target);
  }

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  for (unsigned int i = 0, n = this->file_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        15, this->file(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorResponse)
  return target;
}